

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_fluent.cpp
# Opt level: O2

FormattedNumber __thiscall
icu_63::number::LocalizedNumberFormatter::formatDouble
          (LocalizedNumberFormatter *this,double value,UErrorCode *status)

{
  UFormattedNumberData *this_00;
  UErrorCode *in_RDX;
  UErrorCode *pUVar1;
  UErrorCode *extraout_RDX;
  UErrorCode *extraout_RDX_00;
  UErrorCode *extraout_RDX_01;
  UErrorCode UVar2;
  UFormattedNumberData *p;
  FormattedNumber FVar3;
  
  if (*in_RDX < U_ILLEGAL_ARGUMENT_ERROR) {
    this_00 = (UFormattedNumberData *)UMemory::operator_new((UMemory *)0x158,(size_t)status);
    if (this_00 == (UFormattedNumberData *)0x0) {
      *in_RDX = U_MEMORY_ALLOCATION_ERROR;
      UVar2 = U_MEMORY_ALLOCATION_ERROR;
      in_RDX = extraout_RDX;
    }
    else {
      UVar2 = U_ZERO_ERROR;
      memset(this_00,0,0x158);
      impl::UFormattedNumberData::UFormattedNumberData(this_00);
      impl::DecimalQuantity::setToDouble(&this_00->quantity,value);
      p = this_00;
      formatImpl((LocalizedNumberFormatter *)status,this_00,in_RDX);
      pUVar1 = extraout_RDX_00;
      if (*in_RDX < U_ILLEGAL_ARGUMENT_ERROR) goto LAB_00257c02;
      impl::UFormattedNumberData::~UFormattedNumberData(this_00);
      UMemory::operator_delete((UMemory *)this_00,p);
      UVar2 = *in_RDX;
      in_RDX = extraout_RDX_01;
    }
  }
  else {
    UVar2 = U_ILLEGAL_ARGUMENT_ERROR;
  }
  this_00 = (UFormattedNumberData *)0x0;
  pUVar1 = in_RDX;
LAB_00257c02:
  *(UFormattedNumberData **)
   &(this->super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).fMacros =
       this_00;
  (this->super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).fMacros.notation.
  fUnion.errorCode = UVar2;
  FVar3._8_8_ = pUVar1;
  FVar3.fResults = (UFormattedNumberData *)this;
  return FVar3;
}

Assistant:

FormattedNumber LocalizedNumberFormatter::formatDouble(double value, UErrorCode& status) const {
    if (U_FAILURE(status)) { return FormattedNumber(U_ILLEGAL_ARGUMENT_ERROR); }
    auto results = new UFormattedNumberData();
    if (results == nullptr) {
        status = U_MEMORY_ALLOCATION_ERROR;
        return FormattedNumber(status);
    }
    results->quantity.setToDouble(value);
    formatImpl(results, status);

    // Do not save the results object if we encountered a failure.
    if (U_SUCCESS(status)) {
        return FormattedNumber(results);
    } else {
        delete results;
        return FormattedNumber(status);
    }
}